

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmpEstimation.cpp
# Opt level: O3

Vector computeZmp(Vector *forces,Matrix *sensorPosition1,Matrix *sensorPosition2,uint contactNbr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  undefined4 in_register_0000000c;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar7;
  Index extraout_RDX_01;
  ulong uVar8;
  uint in_R8D;
  int iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  Vector VVar12;
  Matrix M;
  assign_op<double,_double> local_c9;
  undefined1 (*local_c8) [16];
  double *local_c0;
  ulong local_b8;
  Vector *local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  Matrix *local_60;
  ulong local_58;
  undefined8 local_50;
  long local_48;
  Matrix *local_40;
  Matrix<double,__1,__1,_0,__1,__1> *local_38;
  
  local_38 = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(in_register_0000000c,contactNbr);
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x0;
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
  local_40 = sensorPosition2;
  local_c8 = (undefined1 (*) [16])malloc(0x18);
  if (((ulong)local_c8 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (local_c8 == (undefined1 (*) [16])0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)local_c8;
  (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 3;
  IVar7 = extraout_RDX;
  if (in_R8D != 0) {
    iVar9 = 0;
    uVar8 = 0;
    local_88 = 0.0;
    uStack_80 = 0;
    local_98 = 0.0;
    uStack_90 = 0;
    local_a8 = 0.0;
    dStack_a0 = 0.0;
    local_b0 = forces;
    do {
      local_58 = uVar8 & 0xffffffff;
      local_78.m_data =
           (sensorPosition1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_data + local_58;
      local_48 = (sensorPosition1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                 .m_storage.m_rows;
      local_78.m_rows = 6;
      local_78.m_cols = 1;
      local_50 = 0;
      local_60 = sensorPosition1;
      if (local_48 + -6 < (long)local_58) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
                 &local_78);
      if (local_b8 != 6) {
        *(double *)*local_c8 = 0.0;
        *(double *)((long)*local_c8 + 8) = 0.0;
        *(double *)local_c8[1] = 0.0;
        free(local_c0);
        IVar7 = extraout_RDX_01;
        goto LAB_00103ac5;
      }
      local_78.m_data = (double *)0x0;
      local_78.m_rows = 0;
      local_78.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,0x10,4,4);
      if (iVar9 == 1) {
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,local_38,&local_c9);
      }
      else if (iVar9 == 0) {
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,local_40,&local_c9);
      }
      if ((local_78.m_rows < 1) || (local_78.m_cols < 1)) {
LAB_00103ada:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      if ((long)local_b8 < 1) {
LAB_00103af9:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      if (local_78.m_cols == 1) goto LAB_00103ada;
      if (local_b8 == 1) goto LAB_00103af9;
      if ((ulong)local_78.m_cols < 3) goto LAB_00103ada;
      if (local_b8 < 3) goto LAB_00103af9;
      if ((local_78.m_rows == 1) || ((ulong)local_78.m_rows < 3)) goto LAB_00103ada;
      dVar1 = *local_c0;
      dVar2 = local_c0[1];
      dVar3 = local_c0[2];
      dVar10 = local_78.m_data[local_78.m_rows * 2 + 2] * dVar3 +
               local_78.m_data[2] * dVar1 + local_78.m_data[local_78.m_rows + 2] * dVar2;
      if (0.0 < dVar10) {
        if (((local_b8 == 3) || (local_b8 < 5)) || (local_b8 == 5)) goto LAB_00103af9;
        if (local_78.m_cols == 3) goto LAB_00103ada;
        dVar4 = (local_78.m_data + local_78.m_rows * 3 + 1)[1];
        local_a8 = local_a8 -
                   (((local_78.m_data[local_78.m_rows * 2] * dVar3 +
                     *local_78.m_data * dVar1 + local_78.m_data[local_78.m_rows] * dVar2) * dVar4 +
                    local_c0[5] * local_78.m_data[local_78.m_rows * 2 + 1] +
                    local_78.m_data[1] * local_c0[3] +
                    local_78.m_data[local_78.m_rows + 1] * local_c0[4]) -
                   dVar10 * local_78.m_data[local_78.m_rows * 3]);
        dStack_a0 = ((dVar10 * local_78.m_data[local_78.m_rows * 3 + 1] +
                     local_c0[5] * local_78.m_data[local_78.m_rows * 2] +
                     *local_78.m_data * local_c0[3] + local_78.m_data[local_78.m_rows] * local_c0[4]
                     ) - (dVar3 * local_78.m_data[local_78.m_rows * 2 + 1] +
                         dVar1 * local_78.m_data[1] + dVar2 * local_78.m_data[local_78.m_rows + 1])
                         * dVar4) + dStack_a0;
        local_88 = local_88 + dVar10;
        local_98 = local_98 + dVar4 * dVar10;
      }
      free(local_78.m_data);
      free(local_c0);
      uVar8 = uVar8 + 6;
      iVar9 = iVar9 + 1;
    } while ((ulong)in_R8D * 6 != uVar8);
    IVar7 = extraout_RDX_00;
    if ((local_88 != 0.0) || (forces = local_b0, NAN(local_88))) {
      auVar5._8_8_ = dStack_a0;
      auVar5._0_8_ = local_a8;
      auVar11._8_8_ = local_88;
      auVar11._0_8_ = local_88;
      auVar11 = divpd(auVar5,auVar11);
      *local_c8 = auVar11;
      *(double *)local_c8[1] = local_98 / local_88;
      goto LAB_00103ac5;
    }
  }
  *(double *)*local_c8 = 0.0;
  *(double *)((long)*local_c8 + 8) = 0.0;
  *(double *)local_c8[1] = 0.0;
  local_b0 = forces;
LAB_00103ac5:
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar7;
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_b0;
  return (Vector)VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector computeZmp(Vector & forces, Matrix & sensorPosition1, Matrix & sensorPosition2, unsigned contactNbr)
{
  double fnormal = 0;
  double sumZmpx = 0;
  double sumZmpy = 0;
  double sumZmpz = 0;
  Vector zmp;
  zmp.resize(3);

  for(unsigned int i = 0; i < contactNbr; ++i)
  {
    const Vector & f = forces.block(i * 6, 0, 6, 1);
    // Check that force is of dimension 6
    if(f.size() != 6)
    {
      zmp.fill(0.);
      return zmp;
    }

    Matrix M;
    M.resize(4, 4);
    if(i == 0)
    {
      M = sensorPosition1;
    }
    if(i == 1)
    {
      M = sensorPosition2;
    }

    double fx = M(0, 0) * f(0) + M(0, 1) * f(1) + M(0, 2) * f(2);
    double fy = M(1, 0) * f(0) + M(1, 1) * f(1) + M(1, 2) * f(2);
    double fz = M(2, 0) * f(0) + M(2, 1) * f(1) + M(2, 2) * f(2);

    if(fz > 0)
    {
      double Mx = M(0, 0) * f(3) + M(0, 1) * f(4) + M(0, 2) * f(5) + M(1, 3) * fz - M(2, 3) * fy;
      double My = M(1, 0) * f(3) + M(1, 1) * f(4) + M(1, 2) * f(5) + M(2, 3) * fx - M(0, 3) * fz;
      fnormal += fz;
      sumZmpx -= My;
      sumZmpy += Mx;
      sumZmpz += fz * M(2, 3);
    }
  }
  if(fnormal != 0)
  {
    zmp(0) = sumZmpx / fnormal;
    zmp(1) = sumZmpy / fnormal;
    zmp(2) = sumZmpz / fnormal;
  }
  else
  {
    zmp.fill(0.);
  }
  return zmp;
}